

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_add_range_nvals
               (array_container_t *array,uint32_t min,uint32_t max,int32_t nvals_less,
               int32_t nvals_greater)

{
  int min_00;
  uint local_28;
  uint32_t i;
  int32_t union_cardinality;
  int32_t nvals_greater_local;
  int32_t nvals_less_local;
  uint32_t max_local;
  uint32_t min_local;
  array_container_t *array_local;
  
  min_00 = nvals_less + (max - min) + 1 + nvals_greater;
  if (array->capacity < min_00) {
    array_container_grow(array,min_00,true);
  }
  memmove(array->array + (min_00 - nvals_greater),
          array->array + (array->cardinality - nvals_greater),(long)nvals_greater << 1);
  for (local_28 = 0; local_28 <= max - min; local_28 = local_28 + 1) {
    array->array[nvals_less + local_28] = (short)min + (short)local_28;
  }
  array->cardinality = min_00;
  return;
}

Assistant:

static inline void array_container_add_range_nvals(array_container_t *array,
                                                   uint32_t min, uint32_t max,
                                                   int32_t nvals_less,
                                                   int32_t nvals_greater) {
    int32_t union_cardinality = nvals_less + (max - min + 1) + nvals_greater;
    if (union_cardinality > array->capacity) {
        array_container_grow(array, union_cardinality, true);
    }
    memmove(&(array->array[union_cardinality - nvals_greater]),
            &(array->array[array->cardinality - nvals_greater]),
            nvals_greater * sizeof(uint16_t));
    for (uint32_t i = 0; i <= max - min; i++) {
        array->array[nvals_less + i] = min + i;
    }
    array->cardinality = union_cardinality;
}